

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcBSplineCurve::~IfcBSplineCurve(IfcBSplineCurve *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 *puVar3;
  void *pvVar4;
  
  *(undefined8 *)((long)&this[-1].CurveForm.field_2 + 8) = 0x874198;
  (this->CurveForm)._M_dataplus._M_p = (pointer)0x874260;
  this[-1].ClosedCurve.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vtable + 0x40);
  this[-1].SelfIntersect.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(vtable + 0x68);
  *(undefined8 *)&this[-1].field_0xb8 = 0x874210;
  (this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x874238;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->ControlPointsList).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->ControlPointsList).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  puVar3 = *(undefined1 **)
            &(this->super_IfcBoundedCurve).super_IfcCurve.super_IfcGeometricRepresentationItem.
             field_0x30;
  puVar1 = &(this->super_IfcBoundedCurve).super_IfcCurve.field_0x40;
  if (puVar3 != puVar1) {
    operator_delete(puVar3,*(long *)puVar1 + 1);
  }
  pvVar4 = *(void **)&(this->super_IfcBoundedCurve).super_IfcCurve.
                      super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x18;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&(this->super_IfcBoundedCurve).super_IfcCurve.
                                     super_IfcGeometricRepresentationItem.field_0x28 - (long)pvVar4)
    ;
  }
  operator_delete((void *)((long)&this[-1].CurveForm.field_2 + 8),200);
  return;
}

Assistant:

IfcBSplineCurve() : Object("IfcBSplineCurve") {}